

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstatsindex.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_193474c::DBVal::Unserialize<DataStream>(DBVal *this,DataStream *s)

{
  DBVal *in_RDI;
  long in_FS_OFFSET;
  DataStream *s_00;
  
  s_00 = *(DataStream **)(in_FS_OFFSET + 0x28);
  Unser<DataStream>(s_00,in_RDI);
  if (*(DataStream **)(in_FS_OFFSET + 0x28) == s_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(DBVal, obj)
    {
        READWRITE(obj.muhash);
        READWRITE(obj.transaction_output_count);
        READWRITE(obj.bogo_size);
        READWRITE(obj.total_amount);
        READWRITE(obj.total_subsidy);
        READWRITE(obj.total_unspendable_amount);
        READWRITE(obj.total_prevout_spent_amount);
        READWRITE(obj.total_new_outputs_ex_coinbase_amount);
        READWRITE(obj.total_coinbase_amount);
        READWRITE(obj.total_unspendables_genesis_block);
        READWRITE(obj.total_unspendables_bip30);
        READWRITE(obj.total_unspendables_scripts);
        READWRITE(obj.total_unspendables_unclaimed_rewards);
    }